

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O0

void spell_imbue_regeneration(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  int iVar2;
  CClass *this;
  CHAR_DATA *in_RCX;
  CHAR_DATA *in_RDX;
  int in_EDI;
  AFFECT_DATA af;
  CHAR_DATA *victim;
  CHAR_DATA *in_stack_ffffffffffffff48;
  CHAR_DATA *in_stack_ffffffffffffff50;
  CHAR_DATA *in_stack_ffffffffffffff58;
  CHAR_DATA *ch_00;
  CHAR_DATA *in_stack_ffffffffffffff60;
  
  bVar1 = is_affected(in_RCX,(int)gsn_atrophy);
  if (bVar1) {
    act((char *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
        in_stack_ffffffffffffff48,0);
    send_to_char((char *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    affect_strip(in_stack_ffffffffffffff60,(int)((ulong)in_stack_ffffffffffffff58 >> 0x20));
  }
  else {
    iVar2 = skill_lookup((char *)in_stack_ffffffffffffff58);
    bVar1 = is_affected(in_RCX,iVar2);
    if (bVar1) {
      act((char *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
          in_stack_ffffffffffffff48,0);
      send_to_char((char *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      skill_lookup((char *)in_stack_ffffffffffffff58);
      affect_strip(in_RCX,(int)((ulong)in_stack_ffffffffffffff58 >> 0x20));
    }
    else {
      ch_00 = in_RCX;
      iVar2 = skill_lookup((char *)in_RCX);
      bVar1 = is_affected(ch_00,iVar2);
      if (bVar1) {
        if (in_RCX == in_RDX) {
          send_to_char((char *)in_stack_ffffffffffffff60,ch_00);
          act((char *)in_stack_ffffffffffffff60,ch_00,in_stack_ffffffffffffff50,
              in_stack_ffffffffffffff48,0);
        }
        else {
          act((char *)in_stack_ffffffffffffff60,ch_00,in_stack_ffffffffffffff50,
              in_stack_ffffffffffffff48,0);
          act((char *)in_stack_ffffffffffffff60,ch_00,in_stack_ffffffffffffff50,
              in_stack_ffffffffffffff48,0);
          act((char *)in_stack_ffffffffffffff60,ch_00,in_stack_ffffffffffffff50,
              in_stack_ffffffffffffff48,0);
        }
        skill_lookup((char *)ch_00);
        affect_strip(in_stack_ffffffffffffff60,(int)((ulong)ch_00 >> 0x20));
      }
      else {
        bVar1 = is_affected(in_RCX,in_EDI);
        if (bVar1) {
          if (in_RCX == in_RDX) {
            send_to_char((char *)in_stack_ffffffffffffff60,ch_00);
          }
          else {
            send_to_char((char *)in_stack_ffffffffffffff60,ch_00);
          }
        }
        else {
          init_affect((AFFECT_DATA *)0x621564);
          bVar1 = is_npc(in_stack_ffffffffffffff48);
          if (!bVar1) {
            this = char_data::Class(in_stack_ffffffffffffff60);
            CClass::GetIndex(this);
          }
          affect_to_char(in_stack_ffffffffffffff50,(AFFECT_DATA *)in_stack_ffffffffffffff48);
          send_to_char((char *)in_stack_ffffffffffffff60,ch_00);
          if (in_RCX != in_RDX) {
            send_to_char((char *)in_stack_ffffffffffffff60,ch_00);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void spell_imbue_regeneration(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	AFFECT_DATA af;

	if (is_affected(victim, gsn_atrophy))
	{
		act("$n's body stops wasting away.", victim, 0, 0, TO_ROOM);
		send_to_char("Your body stops wasting away.\n\r", victim);
		affect_strip(victim, gsn_atrophy);
		return;
	}

	if (is_affected(victim, skill_lookup("prevent healing")))
	{
		act("$n's sickly looking complexion clears up.", victim, 0, 0, TO_ROOM);
		send_to_char("You no longer feel so sick and weary.\n\r", victim);
		affect_strip(victim, skill_lookup("prevent healing"));
		return;
	}

	if (is_affected(victim, skill_lookup("wither")))
	{
		if (victim != ch)
		{
			act("$N's emaciated body heals up with your touch.", ch, 0, victim, TO_CHAR);
			act("Your emaciated body heals up with $n's touch.", ch, 0, victim, TO_VICT);
			act("$N's emaciated body heals up with $n's touch.", ch, 0, victim, TO_NOTVICT);
		}
		else
		{
			send_to_char("Your emaciated body parts heal up.\n\r", ch);
			act("$n's emaciated body heals up.", ch, 0, 0, TO_ROOM);
		}

		affect_strip(victim, skill_lookup("wither"));
		return;
	}

	if (is_affected(victim, sn))
	{
		if (victim == ch)
			send_to_char("You are already healing at an improved rate.\n\r", ch);
		else
			send_to_char("They are already healing at an improved rate.\n\r", ch);

		return;
	}

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = AFT_COMMUNE;
	af.type = sn;
	af.location = APPLY_REGENERATION;
	af.modifier = level / 11;

	if (!is_npc(ch) && ch->Class()->GetIndex() == CLASS_HEALER)
		af.modifier += 2;

	af.level = level;
	af.duration = level / 5;
	af.mod_name = MOD_REGEN;
	affect_to_char(victim, &af);

	send_to_char("You feel your body warm with an inner health.\n\r", victim);

	if (victim != ch)
		send_to_char("You boost their recuperation ability.\n\r", ch);
}